

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_ssse3_intr.c
# Opt level: O0

void ihevc_itrans_recon_4x4_ttype1_ssse3
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 *puVar23;
  undefined4 *in_RCX;
  ulong *in_RDX;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i m_temp_reg_36;
  __m128i m_temp_reg_35;
  __m128i m_temp_reg_34;
  __m128i m_temp_reg_33;
  __m128i m_temp_reg_32;
  __m128i m_temp_reg_31;
  __m128i m_temp_reg_30;
  __m128i m_temp_reg_25;
  __m128i m_temp_reg_24;
  __m128i m_temp_reg_23;
  __m128i m_temp_reg_22;
  __m128i m_temp_reg_21;
  __m128i m_temp_reg_20;
  __m128i m_temp_reg_14;
  __m128i m_temp_reg_13;
  __m128i m_temp_reg_12;
  __m128i m_temp_reg_11;
  __m128i m_temp_reg_10;
  __m128i m_temp_reg_4;
  __m128i m_temp_reg_3;
  __m128i m_temp_reg_2;
  __m128i m_temp_reg_1;
  __m128i m_temp_reg_0;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined4 local_1468;
  undefined2 uStack_1464;
  undefined2 uStack_1462;
  undefined2 uStack_1460;
  undefined2 uStack_145e;
  undefined2 uStack_145c;
  undefined2 uStack_145a;
  undefined2 local_1458;
  undefined4 uStack_1450;
  undefined2 uStack_144c;
  undefined2 uStack_144a;
  undefined4 local_1448;
  undefined2 uStack_1444;
  undefined2 uStack_1442;
  undefined2 uStack_1440;
  undefined2 uStack_143e;
  undefined2 uStack_143c;
  undefined2 uStack_143a;
  undefined1 uStack_1436;
  undefined1 uStack_1435;
  undefined1 uStack_1434;
  undefined1 uStack_1433;
  undefined1 uStack_1432;
  undefined1 uStack_1431;
  undefined1 uStack_142e;
  undefined1 uStack_142d;
  undefined1 uStack_142c;
  undefined1 uStack_142b;
  undefined1 uStack_142a;
  undefined1 uStack_1429;
  undefined2 local_12a8;
  undefined2 uStack_12a6;
  undefined2 uStack_12a4;
  undefined2 uStack_12a2;
  undefined2 local_1288;
  undefined2 uStack_1286;
  undefined2 uStack_1284;
  undefined2 uStack_1282;
  undefined2 local_1268;
  undefined2 uStack_1266;
  undefined2 uStack_1264;
  undefined2 uStack_1262;
  undefined2 local_1248;
  undefined2 uStack_1246;
  undefined2 uStack_1244;
  undefined2 local_1228;
  undefined2 uStack_1226;
  undefined2 uStack_1224;
  undefined2 local_1218;
  undefined2 uStack_1216;
  undefined2 uStack_1214;
  undefined2 local_1208;
  undefined2 uStack_1206;
  undefined2 uStack_1204;
  undefined2 local_11f8;
  undefined2 uStack_11f6;
  undefined2 uStack_11f4;
  undefined2 local_11a8;
  undefined2 uStack_11a6;
  undefined2 uStack_11a4;
  undefined2 uStack_11a2;
  undefined2 local_1198;
  undefined2 uStack_1196;
  undefined2 uStack_1194;
  undefined2 uStack_1192;
  undefined2 local_1188;
  undefined2 uStack_1186;
  undefined2 uStack_1184;
  undefined2 uStack_1182;
  undefined2 local_1178;
  undefined2 uStack_1176;
  undefined2 uStack_1174;
  undefined2 uStack_1172;
  undefined4 uStack_1044;
  undefined4 uStack_103c;
  undefined4 uStack_f44;
  undefined4 uStack_f3c;
  undefined4 uStack_f04;
  undefined4 uStack_f00;
  undefined4 uStack_efc;
  undefined4 uStack_ef4;
  undefined4 uStack_ef0;
  undefined4 uStack_eec;
  undefined4 uStack_d14;
  undefined4 uStack_d0c;
  undefined4 uStack_d04;
  undefined4 uStack_cfc;
  undefined4 uStack_cf4;
  undefined4 uStack_cec;
  undefined4 uStack_c34;
  undefined4 uStack_c2c;
  undefined4 uStack_c14;
  undefined4 uStack_c0c;
  undefined4 uStack_b34;
  undefined4 uStack_b2c;
  undefined4 uStack_b14;
  undefined4 uStack_b0c;
  undefined4 uStack_ab4;
  undefined4 uStack_aac;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_714;
  undefined4 uStack_70c;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined4 uStack_534;
  undefined4 uStack_52c;
  undefined8 local_4e8;
  undefined8 local_4a8;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  WORD32 *pi4_dst;
  WORD32 i4_shift;
  __m128i m_zero;
  __m128i m_ge_zero16b_flag_row3;
  __m128i m_ge_zero16b_flag_row2;
  __m128i m_ge_zero16b_flag_row1;
  __m128i m_ge_zero16b_flag_row0;
  __m128i m_count;
  __m128i m_rdng_factor;
  
  lVar2 = *in_RDI;
  plVar1 = (long *)((long)in_RDI + (long)in_R8D * 2);
  lVar3 = *plVar1;
  plVar1 = (long *)((long)plVar1 + (long)in_R8D * 2);
  lVar4 = *plVar1;
  lVar5 = *(long *)((long)plVar1 + (long)in_R8D * 2);
  local_1248 = (short)lVar2;
  uStack_1246 = (short)((ulong)lVar2 >> 0x10);
  uStack_1244 = (short)((ulong)lVar2 >> 0x20);
  local_1268 = (short)lVar3;
  uStack_1266 = (short)((ulong)lVar3 >> 0x10);
  uStack_1264 = (short)((ulong)lVar3 >> 0x20);
  uStack_1262 = (undefined2)((ulong)lVar3 >> 0x30);
  local_1288 = (short)lVar4;
  uStack_1286 = (short)((ulong)lVar4 >> 0x10);
  uStack_1284 = (short)((ulong)lVar4 >> 0x20);
  uStack_1282 = (undefined2)((ulong)lVar4 >> 0x30);
  local_12a8 = (short)lVar5;
  uStack_12a6 = (short)((ulong)lVar5 >> 0x10);
  uStack_12a4 = (short)((ulong)lVar5 >> 0x20);
  uStack_12a2 = (undefined2)((ulong)lVar5 >> 0x30);
  uStack_1436 = (undefined1)-(ushort)(local_1248 < 0);
  uStack_1435 = (undefined1)((ushort)-(ushort)(local_1248 < 0) >> 8);
  uStack_1434 = (undefined1)((ulong)lVar2 >> 0x10);
  uStack_1433 = (undefined1)((ulong)lVar2 >> 0x18);
  uStack_1432 = (undefined1)-(ushort)(uStack_1246 < 0);
  uStack_1431 = (undefined1)((ushort)-(ushort)(uStack_1246 < 0) >> 8);
  uStack_142e = (undefined1)-(ushort)(uStack_1244 < 0);
  uStack_142d = (undefined1)((ushort)-(ushort)(uStack_1244 < 0) >> 8);
  uStack_142c = (undefined1)((ulong)lVar2 >> 0x30);
  uStack_142b = (undefined1)((ulong)lVar2 >> 0x38);
  uStack_142a = (undefined1)-(ushort)(lVar2 < 0);
  uStack_1429 = (undefined1)((ushort)-(ushort)(lVar2 < 0) >> 8);
  local_1448 = CONCAT22(-(ushort)(local_1268 < 0),local_1268);
  _local_1448 = CONCAT24(uStack_1266,local_1448);
  _local_1448 = CONCAT26(-(ushort)(uStack_1266 < 0),_local_1448);
  uStack_1440 = uStack_1264;
  uStack_143e = -(ushort)(uStack_1264 < 0);
  uStack_143c = uStack_1262;
  uStack_143a = -(ushort)(lVar3 < 0);
  iVar35 = CONCAT22(-(ushort)(local_1288 < 0),local_1288);
  uStack_1450 = CONCAT22(-(ushort)(uStack_1284 < 0),uStack_1284);
  _uStack_1450 = CONCAT26(-(ushort)(lVar4 < 0),CONCAT24(uStack_1282,uStack_1450));
  local_1468 = CONCAT22(-(ushort)(local_12a8 < 0),local_12a8);
  _local_1468 = CONCAT24(uStack_12a6,local_1468);
  _local_1468 = CONCAT26(-(ushort)(uStack_12a6 < 0),_local_1468);
  uStack_1460 = uStack_12a4;
  uStack_145e = -(ushort)(uStack_12a4 < 0);
  uStack_145c = uStack_12a2;
  uStack_145a = -(ushort)(lVar5 < 0);
  iVar27 = CONCAT13(uStack_1435,CONCAT12(uStack_1436,local_1248));
  iVar28 = CONCAT13(uStack_142d,CONCAT12(uStack_142e,uStack_1244));
  uStack_cf4 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20)
  ;
  uStack_cec = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar28)))) >> 0x20)
  ;
  uStack_d04 = (int)(CONCAT26(-(ushort)(uStack_1286 < 0),CONCAT24(uStack_1286,iVar35)) >> 0x20);
  uStack_cfc = (int)((ulong)_uStack_1450 >> 0x20);
  uStack_874 = (int)((ulong)_local_1448 >> 0x20);
  uStack_870 = local_1448._8_4_;
  uStack_86c = local_1448._12_4_;
  iVar24 = CONCAT13(uStack_1435,CONCAT12(uStack_1436,local_1248));
  iVar32 = CONCAT13(uStack_142d,CONCAT12(uStack_142e,uStack_1244));
  uStack_534 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar24)))) >> 0x20)
  ;
  uStack_52c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar32)))) >> 0x20)
  ;
  iVar24 = iVar24 + iVar35;
  iVar32 = iVar32 + uStack_1450;
  uStack_564 = (int)((ulong)_local_1468 >> 0x20);
  uStack_560 = local_1468._8_4_;
  uStack_55c = local_1468._12_4_;
  iVar25 = CONCAT13(uStack_1435,CONCAT12(uStack_1436,local_1248));
  iVar33 = CONCAT13(uStack_142d,CONCAT12(uStack_142e,uStack_1244));
  uStack_d14 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar25)))) >> 0x20)
  ;
  uStack_d0c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20)
  ;
  iVar25 = iVar25 - local_1468;
  iVar33 = iVar33 - uStack_560;
  local_4a8 = SUB168(ZEXT416(7),0);
  iVar26 = local_1448 * 0x4a + 0x40;
  iVar31 = uStack_874 * 3 + 0x40;
  iVar34 = uStack_870 * 3 + 0x40;
  iVar36 = uStack_86c * 3 + 0x40;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_4a8;
  local_14d8 = CONCAT44((-(uStack_d04 + uStack_564) - (uStack_534 + uStack_d04)) + iVar31 >> auVar14
                        ,iVar24 * 0x1d + (iVar35 + local_1468) * 0x37 + iVar26 >> auVar14);
  uStack_14d0._0_4_ = (-(uStack_1450 + uStack_560) - iVar32) + iVar34 >> auVar14;
  uStack_14d0._4_4_ = (-(uStack_cfc + uStack_55c) - (uStack_52c + uStack_cfc)) + iVar36 >> auVar14;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_4a8;
  local_14e8 = CONCAT44(((uStack_d04 + uStack_564) - (uStack_d14 - uStack_564)) + iVar31 >> auVar13,
                        iVar25 * 0x37 + (iVar35 + local_1468) * -0x1d + iVar26 >> auVar13);
  uStack_14e0._0_4_ = ((uStack_1450 + uStack_560) - iVar33) + iVar34 >> auVar13;
  uStack_14e0._4_4_ = ((uStack_cfc + uStack_55c) - (uStack_d0c - uStack_55c)) + iVar36 >> auVar13;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_4a8;
  local_1508 = CONCAT44((-(uStack_d14 - uStack_564) - (uStack_534 + uStack_d04)) +
                        uStack_874 * -3 + 0x40 >> auVar12,
                        iVar24 * 0x37 + iVar25 * 0x1d + local_1448 * -0x4a + 0x40 >> auVar12);
  uStack_1500 = CONCAT44((-(uStack_d0c - uStack_55c) - (uStack_52c + uStack_cfc)) +
                         uStack_86c * -3 + 0x40 >> auVar12,
                         (-iVar33 - iVar32) + uStack_870 * -3 + 0x40 >> auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_4a8;
  local_14f8 = CONCAT44(((uStack_cf4 - uStack_d04) + uStack_564) * 3 + 0x40 >> auVar11,
                        ((iVar27 - iVar35) + local_1468) * 0x4a + 0x40 >> auVar11);
  uStack_14f0 = CONCAT44(((uStack_cec - uStack_cfc) + uStack_55c) * 3 + 0x40 >> auVar11,
                         ((iVar28 - uStack_1450) + uStack_560) * 3 + 0x40 >> auVar11);
  auVar22._8_8_ = uStack_14d0;
  auVar22._0_8_ = local_14d8;
  auVar21._8_8_ = uStack_14e0;
  auVar21._0_8_ = local_14e8;
  auVar29 = packssdw(auVar22,auVar21);
  auVar20._8_8_ = uStack_14f0;
  auVar20._0_8_ = local_14f8;
  auVar19._8_8_ = uStack_1500;
  auVar19._0_8_ = local_1508;
  auVar30 = packssdw(auVar20,auVar19);
  local_1178 = auVar29._0_2_;
  uStack_1176 = auVar29._2_2_;
  uStack_1174 = auVar29._4_2_;
  uStack_1172 = auVar29._6_2_;
  local_1188 = auVar29._8_2_;
  uStack_1186 = auVar29._10_2_;
  uStack_1184 = auVar29._12_2_;
  uStack_1182 = auVar29._14_2_;
  local_1198 = auVar30._0_2_;
  uStack_1196 = auVar30._2_2_;
  uStack_1194 = auVar30._4_2_;
  uStack_1192 = auVar30._6_2_;
  local_11a8 = auVar30._8_2_;
  uStack_11a6 = auVar30._10_2_;
  uStack_11a4 = auVar30._12_2_;
  uStack_11a2 = auVar30._14_2_;
  local_14d8._0_4_ = CONCAT22(-(ushort)(local_1178 < 0),local_1178);
  local_14d8._0_6_ = CONCAT24(local_1188,(int)local_14d8);
  local_14d8 = CONCAT26(-(ushort)(local_1188 < 0),(undefined6)local_14d8);
  uStack_14d0._0_2_ = local_1198;
  uStack_14d0._2_2_ = -(ushort)(local_1198 < 0);
  uStack_14d0._4_2_ = local_11a8;
  uStack_14d0._6_2_ = -(ushort)(local_11a8 < 0);
  local_14e8._0_4_ = CONCAT22(-(ushort)(uStack_1174 < 0),uStack_1174);
  local_14e8._0_6_ = CONCAT24(uStack_1184,(int)local_14e8);
  local_14e8 = CONCAT26(-(ushort)(uStack_1184 < 0),(undefined6)local_14e8);
  uStack_14e0._0_2_ = uStack_1194;
  uStack_14e0._2_2_ = -(ushort)(uStack_1194 < 0);
  uStack_14e0._4_2_ = uStack_11a4;
  uStack_14e0._6_2_ = -(ushort)(uStack_11a4 < 0);
  local_14f8._0_4_ = CONCAT22(-(ushort)(uStack_1176 < 0),uStack_1176);
  local_14f8 = CONCAT26(-(ushort)(uStack_1186 < 0),CONCAT24(uStack_1186,(int)local_14f8));
  uStack_14f0._0_4_ = CONCAT22(-(ushort)(uStack_1196 < 0),uStack_1196);
  uStack_14f0 = CONCAT26(-(ushort)(uStack_11a6 < 0),CONCAT24(uStack_11a6,(int)uStack_14f0));
  local_1508._0_4_ = CONCAT22(-(ushort)(uStack_1172 < 0),uStack_1172);
  local_1508 = CONCAT26(-(ushort)(uStack_1182 < 0),CONCAT24(uStack_1182,(int)local_1508));
  uStack_1500._0_4_ = CONCAT22(-(ushort)(uStack_1192 < 0),uStack_1192);
  uStack_1500 = CONCAT26(-(ushort)(uStack_11a2 < 0),CONCAT24(uStack_11a2,(int)uStack_1500));
  uStack_ef4 = (int)((ulong)local_14d8 >> 0x20);
  uStack_ef0 = local_14d8._8_4_;
  uStack_eec = local_14d8._12_4_;
  uStack_f04 = (int)((ulong)local_14e8 >> 0x20);
  uStack_f00 = local_14e8._8_4_;
  uStack_efc = local_14e8._12_4_;
  uStack_ab4 = (int)((ulong)local_14f8 >> 0x20);
  uStack_aac = (int)((ulong)uStack_14f0 >> 0x20);
  iVar27 = (int)local_14d8 + (int)local_14e8;
  iVar24 = uStack_ef4 + uStack_f04;
  iVar33 = uStack_ef0 + uStack_f00;
  iVar25 = uStack_eec + uStack_efc;
  uStack_1434 = (undefined1)iVar24;
  uStack_1433 = (undefined1)((uint)iVar24 >> 8);
  uStack_1432 = (undefined1)((uint)iVar24 >> 0x10);
  uStack_1431 = (undefined1)((uint)iVar24 >> 0x18);
  uStack_142c = (undefined1)iVar25;
  uStack_142b = (undefined1)((uint)iVar25 >> 8);
  uStack_142a = (undefined1)((uint)iVar25 >> 0x10);
  uStack_1429 = (undefined1)((uint)iVar25 >> 0x18);
  uStack_714 = (int)((ulong)local_1508 >> 0x20);
  uStack_70c = (int)((ulong)uStack_1500 >> 0x20);
  iVar24 = (int)local_14d8 - (int)local_1508;
  iVar25 = ((int)local_14d8 - (int)local_14e8) + (int)local_1508;
  iVar35 = (uStack_ef0 - uStack_f00) + (int)uStack_1500;
  uStack_b14 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20)
  ;
  uStack_b0c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20)
  ;
  uStack_b34 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20)
  ;
  uStack_b2c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20)
  ;
  uStack_f44 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20)
  ;
  uStack_f3c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20)
  ;
  uStack_c14 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20)
  ;
  uStack_c0c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20)
  ;
  uStack_c34 = (int)(CONCAT17(uStack_1431,
                              CONCAT16(uStack_1432,
                                       CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20)
  ;
  uStack_c2c = (int)(CONCAT17(uStack_1429,
                              CONCAT16(uStack_142a,
                                       CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20)
  ;
  uStack_1044 = (int)(CONCAT17(uStack_1431,
                               CONCAT16(uStack_1432,
                                        CONCAT15(uStack_1433,CONCAT14(uStack_1434,iVar27)))) >> 0x20
                     );
  uStack_103c = (int)(CONCAT17(uStack_1429,
                               CONCAT16(uStack_142a,
                                        CONCAT15(uStack_142b,CONCAT14(uStack_142c,iVar33)))) >> 0x20
                     );
  local_4e8 = SUB168(ZEXT416(0xc),0);
  iVar28 = (int)local_14f8 * 0x4a + 0x800;
  iVar32 = uStack_ab4 * 3 + 0x800;
  iVar26 = (int)uStack_14f0 * 3 + 0x800;
  iVar31 = uStack_aac * 3 + 0x800;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_4e8;
  local_14d8 = CONCAT44((((uStack_b14 - uStack_f44) - uStack_b34) - (uStack_714 + uStack_f04)) +
                        iVar32 >> auVar10,
                        iVar27 * 0x1d + ((int)local_1508 + (int)local_14e8) * 0x37 + iVar28 >>
                        auVar10);
  uStack_14d0._0_4_ = (-((int)uStack_1500 + uStack_f00) - iVar33) + iVar26 >> auVar10;
  uStack_14d0._4_4_ =
       (((uStack_b0c - uStack_f3c) - uStack_b2c) - (uStack_70c + uStack_efc)) + iVar31 >> auVar10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_4e8;
  local_14e8 = CONCAT44(((uStack_714 + uStack_f04) - (uStack_ef4 - uStack_714)) + iVar32 >> auVar9,
                        iVar24 * 0x37 + ((int)local_1508 + (int)local_14e8) * -0x1d + iVar28 >>
                        auVar9);
  uStack_14e0._0_4_ =
       (((int)uStack_1500 + uStack_f00) - (uStack_ef0 - (int)uStack_1500)) + iVar26 >> auVar9;
  uStack_14e0._4_4_ = ((uStack_70c + uStack_efc) - (uStack_eec - uStack_70c)) + iVar31 >> auVar9;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_4e8;
  local_1508 = CONCAT44((((uStack_c14 - uStack_1044) - uStack_c34) - (uStack_ef4 - uStack_714)) +
                        uStack_ab4 * -3 + 0x800 >> auVar30,
                        iVar27 * 0x37 + iVar24 * 0x1d + (int)local_14f8 * -0x4a + 0x800 >> auVar30);
  uStack_1500 = CONCAT44((((uStack_c0c - uStack_103c) - uStack_c2c) - (uStack_eec - uStack_70c)) +
                         uStack_aac * -3 + 0x800 >> auVar30,
                         (-(uStack_ef0 - (int)uStack_1500) - iVar33) + (int)uStack_14f0 * -3 + 0x800
                         >> auVar30);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_4e8;
  local_14f8 = CONCAT44(((uStack_ef4 - uStack_f04) + uStack_714) * 3 + 0x800 >> auVar29,
                        iVar25 * 0x4a + 0x800 >> auVar29);
  uStack_14f0 = CONCAT44(((uStack_eec - uStack_efc) + uStack_70c) * 3 + 0x800 >> auVar29,
                         iVar35 * 3 + 0x800 >> auVar29);
  auVar18._8_8_ = uStack_14d0;
  auVar18._0_8_ = local_14d8;
  auVar17._8_8_ = uStack_14e0;
  auVar17._0_8_ = local_14e8;
  auVar29 = packssdw(auVar18,auVar17);
  auVar16._8_8_ = uStack_14f0;
  auVar16._0_8_ = local_14f8;
  auVar15._8_8_ = uStack_1500;
  auVar15._0_8_ = local_1508;
  auVar30 = packssdw(auVar16,auVar15);
  local_11f8 = auVar29._0_2_;
  uStack_11f6 = auVar29._2_2_;
  uStack_11f4 = auVar29._4_2_;
  local_1208 = auVar29._8_2_;
  uStack_1206 = auVar29._10_2_;
  uStack_1204 = auVar29._12_2_;
  local_1218 = auVar30._0_2_;
  uStack_1216 = auVar30._2_2_;
  uStack_1214 = auVar30._4_2_;
  local_1228 = auVar30._8_2_;
  uStack_1226 = auVar30._10_2_;
  uStack_1224 = auVar30._12_2_;
  uVar6 = *(undefined8 *)((long)in_RDX + (long)in_R9D);
  uVar7 = *(undefined8 *)((long)in_RDX + (long)in_R9D + (long)in_R9D);
  uVar8 = *in_RDX & 0xffffffff;
  local_f8 = (byte)uVar8;
  uStack_f7 = (byte)(uVar8 >> 8);
  uStack_f6 = (byte)(uVar8 >> 0x10);
  uStack_f5 = (byte)(uVar8 >> 0x18);
  local_118 = (byte)uVar6;
  uStack_117 = (byte)((ulong)uVar6 >> 8);
  uStack_116 = (byte)((ulong)uVar6 >> 0x10);
  uStack_115 = (byte)((ulong)uVar6 >> 0x18);
  local_1448._0_2_ = (ushort)local_118;
  uStack_137 = (byte)((ulong)uVar7 >> 8);
  uStack_136 = (byte)((ulong)uVar7 >> 0x10);
  uStack_135 = (byte)((ulong)uVar7 >> 0x18);
  local_1458 = (ushort)(byte)uVar7;
  uStack_c6 = (ushort)uStack_f7;
  uStack_c4 = (ushort)uStack_f6;
  uStack_c2 = (ushort)uStack_f5;
  uStack_be = (ushort)uStack_117;
  uStack_bc = (ushort)uStack_116;
  uStack_ba = (ushort)uStack_115;
  local_11f8 = local_11f8 + (ushort)local_f8;
  local_1208 = local_1208 + uStack_c6;
  local_1218 = local_1218 + uStack_c4;
  local_1228 = local_1228 + uStack_c2;
  uStack_11f6 = uStack_11f6 + (ushort)local_1448;
  uStack_1206 = uStack_1206 + uStack_be;
  uStack_1216 = uStack_1216 + uStack_bc;
  uStack_1226 = uStack_1226 + uStack_ba;
  uStack_e6 = (ushort)uStack_137;
  uStack_e4 = (ushort)uStack_136;
  uStack_e2 = (ushort)uStack_135;
  uStack_11f4 = uStack_11f4 + local_1458;
  uStack_1204 = uStack_1204 + uStack_e6;
  uStack_1214 = uStack_1214 + uStack_e4;
  uStack_1224 = uStack_1224 + uStack_e2;
  *in_RCX = CONCAT13((0 < local_1228) * (local_1228 < 0x100) * (char)local_1228 -
                     (0xff < local_1228),
                     CONCAT12((0 < local_1218) * (local_1218 < 0x100) * (char)local_1218 -
                              (0xff < local_1218),
                              CONCAT11((0 < local_1208) * (local_1208 < 0x100) * (char)local_1208 -
                                       (0xff < local_1208),
                                       (0 < local_11f8) * (local_11f8 < 0x100) * (char)local_11f8 -
                                       (0xff < local_11f8))));
  *(undefined4 *)((long)in_RCX + (long)(int)m_temp_reg_36[1]) =
       CONCAT13((0 < uStack_1226) * (uStack_1226 < 0x100) * (char)uStack_1226 - (0xff < uStack_1226)
                ,CONCAT12((0 < uStack_1216) * (uStack_1216 < 0x100) * (char)uStack_1216 -
                          (0xff < uStack_1216),
                          CONCAT11((0 < uStack_1206) * (uStack_1206 < 0x100) * (char)uStack_1206 -
                                   (0xff < uStack_1206),
                                   (0 < uStack_11f6) * (uStack_11f6 < 0x100) * (char)uStack_11f6 -
                                   (0xff < uStack_11f6))));
  puVar23 = (undefined4 *)((long)in_RCX + (long)(int)m_temp_reg_36[1] + (long)(int)m_temp_reg_36[1])
  ;
  *puVar23 = CONCAT13((0 < uStack_1224) * (uStack_1224 < 0x100) * (char)uStack_1224 -
                      (0xff < uStack_1224),
                      CONCAT12((0 < uStack_1214) * (uStack_1214 < 0x100) * (char)uStack_1214 -
                               (0xff < uStack_1214),
                               CONCAT11((0 < uStack_1204) * (uStack_1204 < 0x100) *
                                        (char)uStack_1204 - (0xff < uStack_1204),
                                        (0 < uStack_11f4) * (uStack_11f4 < 0x100) *
                                        (char)uStack_11f4 - (0xff < uStack_11f4))));
  *(undefined4 *)((long)puVar23 + (long)(int)m_temp_reg_36[1]) = 0;
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_ttype1_ssse3(WORD16 *pi2_src,
                                         WORD16 *pi2_tmp,
                                         UWORD8 *pu1_pred,
                                         UWORD8 *pu1_dst,
                                         WORD32 src_strd,
                                         WORD32 pred_strd,
                                         WORD32 dst_strd,
                                         WORD32 zero_cols,
                                         WORD32 zero_rows)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_20;
    __m128i m_temp_reg_21;
    __m128i m_temp_reg_22;
    __m128i m_temp_reg_23;
    __m128i m_temp_reg_24;
    __m128i m_temp_reg_25;
    __m128i m_temp_reg_30;
    __m128i m_temp_reg_31;
    __m128i m_temp_reg_32;
    __m128i m_temp_reg_33;
    __m128i m_temp_reg_34;
    __m128i m_temp_reg_35;
    __m128i m_temp_reg_36;
    __m128i m_rdng_factor;
    __m128i m_count;

    __m128i m_ge_zero16b_flag_row0;
    __m128i m_ge_zero16b_flag_row1;
    __m128i m_ge_zero16b_flag_row2;
    __m128i m_ge_zero16b_flag_row3;

    __m128i m_zero = _mm_setzero_si128();

    WORD32 i4_shift = IT_SHIFT_STAGE_1;
    UNUSED(zero_cols);
    UNUSED(zero_rows);
    UNUSED(pi2_tmp);
    m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pi2_src);

    m_ge_zero16b_flag_row0 = _mm_cmpgt_epi16(m_zero, m_temp_reg_0);
    m_ge_zero16b_flag_row1 = _mm_cmpgt_epi16(m_zero, m_temp_reg_1);
    m_ge_zero16b_flag_row2 = _mm_cmpgt_epi16(m_zero, m_temp_reg_2);
    m_ge_zero16b_flag_row3 = _mm_cmpgt_epi16(m_zero, m_temp_reg_3);

    m_temp_reg_0 = _mm_unpacklo_epi16(m_temp_reg_0, m_ge_zero16b_flag_row0);
    m_temp_reg_1 = _mm_unpacklo_epi16(m_temp_reg_1, m_ge_zero16b_flag_row1);
    m_temp_reg_2 = _mm_unpacklo_epi16(m_temp_reg_2, m_ge_zero16b_flag_row2);
    m_temp_reg_3 = _mm_unpacklo_epi16(m_temp_reg_3, m_ge_zero16b_flag_row3);

    /*m_temp_reg_0 = _mm_cvtepi16_epi32(m_temp_reg_0);
    m_temp_reg_2 = _mm_cvtepi16_epi32(m_temp_reg_2);

    m_temp_reg_1 = _mm_cvtepi16_epi32(m_temp_reg_1);
    m_temp_reg_3 = _mm_cvtepi16_epi32(m_temp_reg_3);*/

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[3] in m_temp_reg_13 */
    {
        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_1, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_1, 3);
        m_temp_reg_22 = _mm_slli_epi32(m_temp_reg_1, 1);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_13 = _mm_add_epi32(m_temp_reg_22, m_temp_reg_23);
        //m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_1, m_coeff3);
    }

    /* c[0] in m_temp_reg_10 */
    {
        m_temp_reg_10 = _mm_add_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[1] in m_temp_reg_11 */
    {
        m_temp_reg_11 = _mm_add_epi32(m_temp_reg_2, m_temp_reg_3);
    }

    /* c[2] in m_temp_reg_12 */
    {
        m_temp_reg_12 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_3);
    }

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_3);
    }

    /* Stage 1 outputs stored in m_temp_reg_20-23 */
    {
        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_10, 5);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_10, 1);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_10);
        m_temp_reg_30 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_10, m_coeff1);//29*c0

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_11, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_11, 3);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_11);
        m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_11, m_coeff2);//55*c1

        m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_11, 5);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_11, 1);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_11);
        m_temp_reg_32 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_11, m_coeff1);//29*c1

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_12, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_12, 3);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_12);
        m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_12, m_coeff2);//55*c2

        m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_10, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_10, 3);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_10);
        m_temp_reg_34 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_10, m_coeff2);//55*c0

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_12, 5);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_12, 1);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_12);
        m_temp_reg_35 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_12, m_coeff1);//29*c2

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_14, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_14, 3);
        m_temp_reg_22 = _mm_slli_epi32(m_temp_reg_14, 1);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_36 = _mm_add_epi32(m_temp_reg_22, m_temp_reg_23);
        //m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_14, m_coeff3);//74*c4

        m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
        m_count = _mm_cvtsi32_si128(i4_shift);

        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
        m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

        m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
        m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
        m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

        m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

        m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
        m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
        m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
        m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

        m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
        m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

        m_temp_reg_30 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
        m_temp_reg_31 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);

    }

    /* Stage 2 */
    {
        i4_shift = IT_SHIFT_STAGE_2;

        /*m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_20 = _mm_cvtepi16_epi32(m_temp_reg_20);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);
        m_temp_reg_21 = _mm_cvtepi16_epi32(m_temp_reg_21);
        m_temp_reg_22 = _mm_cvtepi16_epi32(m_temp_reg_22);
        m_temp_reg_23 = _mm_cvtepi16_epi32(m_temp_reg_23);*/

        m_ge_zero16b_flag_row0 = _mm_cmpgt_epi16(m_zero, m_temp_reg_30);
        m_ge_zero16b_flag_row1 = _mm_cmpgt_epi16(m_zero, m_temp_reg_31);

        m_temp_reg_20 = _mm_unpacklo_epi16(m_temp_reg_30, m_ge_zero16b_flag_row0);
        m_temp_reg_21 = _mm_unpacklo_epi16(m_temp_reg_31, m_ge_zero16b_flag_row1);
        m_temp_reg_22 = _mm_unpackhi_epi16(m_temp_reg_30, m_ge_zero16b_flag_row0);
        m_temp_reg_23 = _mm_unpackhi_epi16(m_temp_reg_31, m_ge_zero16b_flag_row1);


        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[3] stored in m_temp_reg_3 */
        {
            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_22, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_22, 3);
            m_temp_reg_12 = _mm_slli_epi32(m_temp_reg_22, 1);
            m_temp_reg_13 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
            m_temp_reg_3 = _mm_add_epi32(m_temp_reg_12, m_temp_reg_13);
            //m_temp_reg_3 = _mm_mullo_epi32(m_temp_reg_22, m_coeff3);
        }

        /* c[0] stored in m_temp_reg_0 */
        {
            m_temp_reg_0 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[1] stored in m_temp_reg_1 */
        {
            m_temp_reg_1 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_21);
        }

        /* c[2] stored in m_temp_reg_2 */
        {
            m_temp_reg_2 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_23);
        }

        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_add_epi32(m_temp_reg_4, m_temp_reg_23);
        }

        /* Stage 2 output generation */
        {
            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_0, 5);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_0, 1);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_0);
            m_temp_reg_30 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_0, m_coeff1);//29*c0

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_1, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_1, 3);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_1);
            m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_1, m_coeff2);//55*c1

            m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_1, 5);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_1, 1);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_1);
            m_temp_reg_32 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_1, m_coeff1);//29*c1

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_2, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_2, 3);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_2);
            m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_2, m_coeff2);//55*c2

            m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_0, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_0, 3);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_0);
            m_temp_reg_34 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_0, m_coeff2);//55*c0

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_2, 5);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_2, 1);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_2);
            m_temp_reg_35 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_2, m_coeff1);//29*c2

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_4, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_4, 3);
            m_temp_reg_12 = _mm_slli_epi32(m_temp_reg_4, 1);
            m_temp_reg_13 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
            m_temp_reg_36 = _mm_add_epi32(m_temp_reg_12, m_temp_reg_13);
            //m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_4, m_coeff3);//74*c4

            m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
            m_count = _mm_cvtsi32_si128(i4_shift);

            m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

            m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
            m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

            m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

            m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

            m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
            m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
            m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
            m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

            m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
            m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
            m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
            m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

            m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
            m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

            m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
            m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
        }

        /* Recon and store */
        {
            WORD32 *pi4_dst = (WORD32 *)pu1_dst;

            m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pu1_pred);

            m_temp_reg_0 = _mm_unpacklo_epi8(m_temp_reg_0, m_zero);
            m_temp_reg_1 = _mm_unpacklo_epi8(m_temp_reg_1, m_zero);
            m_temp_reg_2 = _mm_unpacklo_epi8(m_temp_reg_2, m_zero);
            m_temp_reg_3 = _mm_unpacklo_epi8(m_temp_reg_3, m_zero);

            /*m_temp_reg_0 = _mm_cvtepu8_epi16(m_temp_reg_0);
            m_temp_reg_1 = _mm_cvtepu8_epi16(m_temp_reg_1);
            m_temp_reg_2 = _mm_cvtepu8_epi16(m_temp_reg_2);
            m_temp_reg_3 = _mm_cvtepu8_epi16(m_temp_reg_3);*/

            m_temp_reg_0 = _mm_unpacklo_epi64(m_temp_reg_0, m_temp_reg_1);
            m_temp_reg_1 = _mm_unpacklo_epi64(m_temp_reg_2, m_temp_reg_3);

            m_temp_reg_20 = _mm_add_epi16(m_temp_reg_20, m_temp_reg_0);
            m_temp_reg_21 = _mm_add_epi16(m_temp_reg_21, m_temp_reg_1);

            m_temp_reg_0 = _mm_packus_epi16(m_temp_reg_20, m_temp_reg_21);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_0);
            m_temp_reg_1 = _mm_srli_si128(m_temp_reg_0, 4);
            m_temp_reg_2 = _mm_srli_si128(m_temp_reg_0, 8);
            m_temp_reg_3 = _mm_srli_si128(m_temp_reg_0, 12);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
        }
    }
}